

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
booster::locale::dpgettext<char>(char *domain,char *context,char *id,locale *loc)

{
  char *in_RSI;
  basic_message<char> *in_RDI;
  char_type *in_stack_ffffffffffffff08;
  basic_message<char> *in_stack_ffffffffffffff10;
  string *domain_id;
  locale *in_stack_ffffffffffffff20;
  basic_message<char> *in_stack_ffffffffffffff28;
  undefined1 local_c9 [185];
  char *local_10;
  
  local_10 = in_RSI;
  basic_message<char>::basic_message
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(char_type *)in_RDI);
  domain_id = (string *)local_c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_c9 + 1),local_10,(allocator *)domain_id);
  basic_message<char>::str(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,domain_id);
  std::__cxx11::string::~string((string *)(local_c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_c9);
  basic_message<char>::~basic_message(in_RDI);
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI;
}

Assistant:

std::basic_string<CharType>  dpgettext( char const *domain,
                                                CharType const *context,
                                                CharType const *id,
                                                std::locale const &loc=std::locale())
        {
            return basic_message<CharType>(context,id).str(loc,domain);
        }